

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void save_cdef_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int plane,int row,int stripe,int use_highbd
               ,int is_above,RestorationStripeBoundaries *boundaries)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  int width;
  byte bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int height;
  uint8_t *puVar9;
  uint8_t *__dest;
  bool bVar10;
  
  bVar4 = (byte)use_highbd;
  lVar8 = (long)plane;
  puVar9 = (uint8_t *)((long)frame->store_buf_adr[lVar8 + -4] * 2);
  if (use_highbd == 0) {
    puVar9 = frame->store_buf_adr[lVar8 + -4];
  }
  iVar1 = *(int *)((long)frame->store_buf_adr + (ulong)(0 < plane) * 4 + -0x28);
  puVar3 = (&boundaries->stripe_boundary_above)[is_above == 0];
  height = boundaries->stripe_boundary_stride << (bVar4 & 0x1f);
  if (plane < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)(cm->seq_params->subsampling_x != 0);
  }
  uVar2 = cm->superres_upscaled_width;
  uVar7 = (ulong)uVar2;
  width = (int)(uVar2 + uVar5) >> (sbyte)uVar5;
  if (cm->width == uVar2) {
    width = *(int *)((long)frame->store_buf_adr + (ulong)(0 < plane) * 4 + -0x38);
  }
  lVar6 = 2;
  __dest = puVar3 + (long)(stripe * height * 2) + (long)(4 << (bVar4 & 0x1f));
  while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
    memcpy(__dest,puVar9 + (long)(iVar1 << (bVar4 & 0x1f)) * (long)row,
           (long)(width << (bVar4 & 0x1f)));
    __dest = __dest + height;
  }
  extend_lines(puVar3 + (long)(stripe * height * 2) + (long)(4 << (bVar4 & 0x1f)),width,height,
               use_highbd,(int)uVar7,(int)lVar8);
  return;
}

Assistant:

static void save_cdef_boundary_lines(const YV12_BUFFER_CONFIG *frame,
                                     const AV1_COMMON *cm, int plane, int row,
                                     int stripe, int use_highbd, int is_above,
                                     RestorationStripeBoundaries *boundaries) {
  const int is_uv = plane > 0;
  const uint8_t *src_buf = REAL_PTR(use_highbd, frame->buffers[plane]);
  const int src_stride = frame->strides[is_uv] << use_highbd;
  const uint8_t *src_rows = src_buf + row * (ptrdiff_t)src_stride;

  uint8_t *bdry_buf = is_above ? boundaries->stripe_boundary_above
                               : boundaries->stripe_boundary_below;
  uint8_t *bdry_start = bdry_buf + (RESTORATION_EXTRA_HORZ << use_highbd);
  const int bdry_stride = boundaries->stripe_boundary_stride << use_highbd;
  uint8_t *bdry_rows = bdry_start + RESTORATION_CTX_VERT * stripe * bdry_stride;
  const int src_width = frame->crop_widths[is_uv];

  // At the point where this function is called, we've already applied
  // superres. So we don't need to extend the lines here, we can just
  // pull directly from the topmost row of the upscaled frame.
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int upscaled_width = av1_superres_scaled(cm)
                                 ? (cm->superres_upscaled_width + ss_x) >> ss_x
                                 : src_width;
  const int line_bytes = upscaled_width << use_highbd;
  for (int i = 0; i < RESTORATION_CTX_VERT; i++) {
    // Copy the line at 'src_rows' into both context lines
    memcpy(bdry_rows + i * bdry_stride, src_rows, line_bytes);
  }
  extend_lines(bdry_rows, upscaled_width, RESTORATION_CTX_VERT, bdry_stride,
               RESTORATION_EXTRA_HORZ, use_highbd);
}